

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<wchar_t> * __thiscall irr::core::string<wchar_t>::operator=(string<wchar_t> *this,wchar_t *c)

{
  undefined4 uVar1;
  u32 uVar2;
  undefined4 *puVar3;
  long in_RSI;
  string<wchar_t> *in_RDI;
  u32 l;
  u32 len;
  undefined4 local_20;
  
  if (in_RSI == 0) {
    clear(in_RDI,false);
  }
  else {
    uVar2 = calclen((wchar_t *)0x3a00f5);
    ::std::__cxx11::wstring::resize((ulong)in_RDI);
    for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
      uVar1 = *(undefined4 *)(in_RSI + (ulong)local_20 * 4);
      puVar3 = (undefined4 *)::std::__cxx11::wstring::operator[]((ulong)in_RDI);
      *puVar3 = uVar1;
    }
  }
  return in_RDI;
}

Assistant:

string<T> &operator=(const B *const c)
	{
		if (!c) {
			clear();
			return *this;
		}

		// no longer allowed!
		_IRR_DEBUG_BREAK_IF((void *)c == (void *)c_str());

		u32 len = calclen(c);
		str.resize(len);
		for (u32 l = 0; l < len; ++l)
			str[l] = (T)c[l];

		return *this;
	}